

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  float height;
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  stbtt_packedchar *psVar4;
  short sVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [14];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [14];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  unkuint9 Var16;
  undefined1 auVar17 [11];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  unkbyte10 Var20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  uint6 uVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  stbtt_pack_range *psVar30;
  ulong uVar31;
  stbrp_coord *psVar32;
  ushort uVar33;
  char cVar35;
  char cVar36;
  undefined4 extraout_XMM0_Db;
  short sVar37;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar34 [16];
  short sVar40;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  short sVar42;
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  int y0;
  int x0;
  int advance;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  stbtt_pack_range *local_c0;
  stbrp_coord *local_b8;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  stbtt_pack_context *local_98;
  stbtt_pack_range *local_90;
  stbtt_packedchar *local_88;
  long local_80;
  int y1;
  int x1;
  int lsb;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar27 = 0;
  local_b0 = (ulong)(uint)num_ranges;
  if (num_ranges < 1) {
    local_b0 = uVar27;
  }
  local_68._0_4_ = spc->h_oversample;
  local_68._4_4_ = spc->v_oversample;
  uStack_60 = 0;
  local_b8 = &rects->w;
  uVar31 = 0xffffffffffffffff;
  iVar25 = 1;
  lVar29 = 0;
  local_c0 = ranges;
  local_98 = spc;
  do {
    psVar30 = local_c0;
    if (uVar27 == local_b0) {
      spc->h_oversample = (undefined4)local_68;
      spc->v_oversample = local_68._4_4_;
      return iVar25;
    }
    height = local_c0[uVar27].font_size;
    local_a0 = uVar27;
    if (height <= 0.0) {
      uStack_d4 = 0x80000000;
      uStack_d0 = 0x80000000;
      uStack_cc = 0x80000000;
      local_d8 = -height / (float)(ushort)(*(ushort *)(info->data + (long)info->head + 0x12) << 8 |
                                          *(ushort *)(info->data + (long)info->head + 0x12) >> 8);
    }
    else {
      local_d8 = stbtt_ScaleForPixelHeight(info,height);
      uStack_d4 = extraout_XMM0_Db;
      uStack_d0 = extraout_XMM0_Dc;
      uStack_cc = extraout_XMM0_Dd;
    }
    psVar30 = psVar30 + uVar27;
    uVar27._0_1_ = psVar30->h_oversample;
    uVar27._1_1_ = psVar30->v_oversample;
    uVar27._2_6_ = *(undefined6 *)&psVar30->field_0x22;
    auVar6._8_6_ = 0;
    auVar6._0_8_ = uVar27;
    auVar6[0xe] = (char)((uint6)uVar27._2_6_ >> 0x28);
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar27;
    auVar8[0xc] = (char)((uint6)uVar27._2_6_ >> 0x20);
    auVar8._13_2_ = auVar6._13_2_;
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar27;
    auVar9._12_3_ = auVar8._12_3_;
    auVar10._8_2_ = 0;
    auVar10._0_8_ = uVar27;
    auVar10[10] = (char)((uint6)uVar27._2_6_ >> 0x18);
    auVar10._11_4_ = auVar9._11_4_;
    auVar11._8_2_ = 0;
    auVar11._0_8_ = uVar27;
    auVar11._10_5_ = auVar10._10_5_;
    auVar13[8] = (char)((uint6)uVar27._2_6_ >> 0x10);
    auVar13._0_8_ = uVar27;
    auVar13._9_6_ = auVar11._9_6_;
    auVar15._7_8_ = 0;
    auVar15._0_7_ = auVar13._8_7_;
    cVar36 = (char)((uint6)uVar27._2_6_ >> 8);
    Var16 = CONCAT81(SUB158(auVar15 << 0x40,7),cVar36);
    auVar22._9_6_ = 0;
    auVar22._0_9_ = Var16;
    cVar35 = (char)uVar27._2_6_;
    auVar17._1_10_ = SUB1510(auVar22 << 0x30,5);
    auVar17[0] = cVar35;
    auVar23._11_4_ = 0;
    auVar23._0_11_ = auVar17;
    auVar18._1_12_ = SUB1512(auVar23 << 0x20,3);
    auVar18[0] = uVar27._1_1_;
    uVar33 = CONCAT11(0,(undefined1)uVar27);
    auVar14._2_13_ = auVar18;
    auVar14._0_2_ = uVar33;
    sVar40 = 1 - auVar18._0_2_;
    sVar42 = -auVar17._0_2_;
    sVar37 = (short)Var16;
    sVar5 = -sVar37;
    auVar7._10_2_ = 0;
    auVar7._0_10_ = auVar14._0_10_;
    auVar7._12_2_ = sVar37;
    uVar24 = CONCAT42(auVar7._10_4_,auVar17._0_2_);
    auVar19._6_8_ = 0;
    auVar19._0_6_ = uVar24;
    Var20 = CONCAT82(SUB148(auVar19 << 0x40,6),auVar18._0_2_);
    auVar12._4_10_ = Var20;
    auVar12._0_4_ = CONCAT22(0,uVar33);
    spc->h_oversample = (int)auVar12._0_8_;
    spc->v_oversample = (int)((ulong)auVar12._0_8_ >> 0x20);
    auVar39._0_4_ = (float)CONCAT22(0,uVar33);
    auVar39._4_4_ = (float)(int)Var20;
    auVar39._8_4_ = (float)(int)uVar24;
    auVar39._12_4_ = (float)(auVar7._10_4_ >> 0x10);
    local_58 = divps(_DAT_001500e0,auVar39);
    auVar43[0] = -((undefined1)uVar27 == 0);
    auVar43[1] = -((undefined1)uVar27 == 0);
    auVar43[2] = -((undefined1)uVar27 == 0);
    auVar43[3] = -((undefined1)uVar27 == 0);
    auVar43[4] = -(uVar27._1_1_ == '\0');
    auVar43[5] = -(uVar27._1_1_ == '\0');
    auVar43[6] = -(uVar27._1_1_ == '\0');
    auVar43[7] = -(uVar27._1_1_ == '\0');
    auVar43[8] = -(cVar35 == '\0');
    auVar43[9] = -(cVar35 == '\0');
    auVar43[10] = -(cVar35 == '\0');
    auVar43[0xb] = -(cVar35 == '\0');
    auVar43[0xc] = -(cVar36 == '\0');
    auVar43[0xd] = -(cVar36 == '\0');
    auVar43[0xe] = -(cVar36 == '\0');
    auVar43[0xf] = -(cVar36 == '\0');
    Var20 = CONCAT64(CONCAT42(CONCAT22(sVar5,sVar5),sVar42),CONCAT22(sVar42,sVar5));
    auVar21._4_8_ = (long)((unkuint10)Var20 >> 0x10);
    auVar21._2_2_ = sVar40;
    auVar21._0_2_ = sVar40;
    auVar38._0_4_ = (float)(int)(short)(1 - uVar33);
    auVar38._4_4_ = (float)(auVar21._0_4_ >> 0x10);
    auVar38._8_4_ = (float)((int)((unkuint10)Var20 >> 0x10) >> 0x10);
    auVar38._12_4_ = (float)(int)sVar5;
    auVar34._0_4_ = auVar39._0_4_ + auVar39._0_4_;
    auVar34._4_4_ = auVar39._4_4_ + auVar39._4_4_;
    auVar34._8_4_ = auVar39._8_4_ + auVar39._8_4_;
    auVar34._12_4_ = auVar39._12_4_ + auVar39._12_4_;
    local_48 = divps(auVar38,auVar34);
    local_48 = ~auVar43 & local_48;
    local_a8 = (long)(int)lVar29;
    psVar32 = local_b8 + local_a8 * 8;
    lVar29 = 0;
    local_90 = psVar30;
    for (uVar28 = 0; (long)uVar28 < (long)psVar30->num_chars; uVar28 = uVar28 + 1) {
      if (*(uint *)(psVar32 + 4) == 0) {
LAB_0011065a:
        iVar25 = 0;
      }
      else {
        uVar33 = *psVar32;
        if (uVar33 == 0) {
          if (((spc->skip_missing != 0) || (psVar32[1] != 0)) || ((int)uVar31 < 0))
          goto LAB_0011065a;
          psVar4 = psVar30->chardata_for_range;
          auVar39 = *(undefined1 (*) [16])(psVar4 + (uVar31 & 0xffffffff));
          *(undefined1 (*) [16])((long)&psVar4->yoff + lVar29) =
               *(undefined1 (*) [16])&psVar4[uVar31 & 0xffffffff].yoff;
          *(undefined1 (*) [16])((long)&psVar4->x0 + lVar29) = auVar39;
        }
        else {
          uVar1 = psVar32[1];
          if (uVar1 == 0) goto LAB_0011065a;
          if (psVar30->array_of_unicode_codepoints == (int *)0x0) {
            iVar26 = psVar30->first_unicode_codepoint_in_range + (int)uVar28;
          }
          else {
            iVar26 = psVar30->array_of_unicode_codepoints[uVar28];
          }
          local_88 = psVar30->chardata_for_range;
          local_80 = lVar29;
          iVar26 = stbtt_FindGlyphIndex(info,iVar26);
          spc = local_98;
          uVar2 = local_98->padding;
          auVar39 = pshuflw(ZEXT416(uVar2),ZEXT416(uVar2),0);
          *(uint *)(psVar32 + 2) =
               CONCAT22(auVar39._2_2_ + (short)(*(uint *)(psVar32 + 2) >> 0x10),
                        auVar39._0_2_ + (short)*(uint *)(psVar32 + 2));
          *psVar32 = uVar33 - (short)uVar2;
          psVar32[1] = uVar1 - (short)uVar2;
          stbtt_GetGlyphHMetrics(info,iVar26,&advance,&lsb);
          stbtt_GetGlyphBitmapBox
                    (info,iVar26,(float)spc->h_oversample * local_d8,
                     (float)spc->v_oversample * local_d8,&x0,&y0,&x1,&y1);
          stbtt_MakeGlyphBitmapSubpixel
                    (info,spc->pixels +
                          (ulong)psVar32[3] * (long)spc->stride_in_bytes + (ulong)psVar32[2],
                     ((uint)*psVar32 - spc->h_oversample) + 1,
                     ((uint)psVar32[1] - spc->v_oversample) + 1,spc->stride_in_bytes,
                     (float)spc->h_oversample * local_d8,(float)spc->v_oversample * local_d8,0.0,0.0
                     ,iVar26);
          if (1 < spc->h_oversample) {
            stbtt__h_prefilter(spc->pixels +
                               (ulong)psVar32[3] * (long)spc->stride_in_bytes + (ulong)psVar32[2],
                               (uint)*psVar32,(uint)psVar32[1],spc->stride_in_bytes,
                               spc->h_oversample);
          }
          if (1 < spc->v_oversample) {
            stbtt__v_prefilter(spc->pixels +
                               (ulong)psVar32[3] * (long)spc->stride_in_bytes + (ulong)psVar32[2],
                               (uint)*psVar32,(uint)psVar32[1],spc->stride_in_bytes,
                               spc->v_oversample);
          }
          *(float *)((long)&local_88->xadvance + local_80) = (float)advance * local_d8;
          *(ulong *)((long)&local_88->xoff + local_80) =
               CONCAT44((float)y0 * local_58._4_4_ + local_48._4_4_,
                        (float)x0 * local_58._0_4_ + local_48._0_4_);
          uVar2 = *(uint *)(psVar32 + 2);
          *(uint *)((long)&local_88->x0 + local_80) = uVar2;
          uVar3 = *(uint *)psVar32;
          sVar42 = (short)(uVar3 >> 0x10);
          *(uint *)((long)&local_88->x1 + local_80) =
               CONCAT22((short)(uVar2 >> 0x10) + sVar42,(short)uVar2 + (short)uVar3);
          auVar41._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
          auVar41._4_2_ = sVar42;
          auVar41._0_4_ = uVar3;
          *(ulong *)((long)&local_88->xoff2 + local_80) =
               CONCAT44((float)(auVar41._4_4_ + y0) * local_58._4_4_ + local_48._4_4_,
                        (float)(int)((uVar3 & 0xffff) + x0) * local_58._0_4_ + local_48._0_4_);
          if (iVar26 == 0) {
            uVar31 = uVar28;
          }
          uVar31 = uVar31 & 0xffffffff;
          lVar29 = local_80;
          psVar30 = local_90;
        }
      }
      lVar29 = lVar29 + 0x1c;
      psVar32 = psVar32 + 8;
    }
    uVar27 = local_a0 + 1;
    lVar29 = local_a8 + uVar28;
  } while( true );
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
int i,j,k, missing_glyph = -1, return_value = 1;

/*  save current values */
int old_h_over = spc->h_oversample;
int old_v_over = spc->v_oversample;

k = 0;
for (i=0; i < num_ranges; ++i) {
float fh = ranges[i].font_size;
float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
float recip_h,recip_v,sub_x,sub_y;
spc->h_oversample = ranges[i].h_oversample;
spc->v_oversample = ranges[i].v_oversample;
recip_h = 1.0f / spc->h_oversample;
recip_v = 1.0f / spc->v_oversample;
sub_x = stbtt__oversample_shift(spc->h_oversample);
sub_y = stbtt__oversample_shift(spc->v_oversample);
for (j=0; j < ranges[i].num_chars; ++j) {
stbrp_rect *r = &rects[k];
if (r->was_packed && r->w != 0 && r->h != 0) {
stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
int advance, lsb, x0,y0,x1,y1;
int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
int glyph = stbtt_FindGlyphIndex(info, codepoint);
stbrp_coord pad = (stbrp_coord) spc->padding;

/*  pad on left and top */
r->x += pad;
r->y += pad;
r->w -= pad;
r->h -= pad;
stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
stbtt_GetGlyphBitmapBox(info, glyph,
scale * spc->h_oversample,
scale * spc->v_oversample,
&x0,&y0,&x1,&y1);
stbtt_MakeGlyphBitmapSubpixel(info,
spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w - spc->h_oversample+1,
r->h - spc->v_oversample+1,
spc->stride_in_bytes,
scale * spc->h_oversample,
scale * spc->v_oversample,
0,0,
glyph);

if (spc->h_oversample > 1)
stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w, r->h, spc->stride_in_bytes,
spc->h_oversample);

if (spc->v_oversample > 1)
stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
r->w, r->h, spc->stride_in_bytes,
spc->v_oversample);

bc->x0       = (stbtt_int16)  r->x;
bc->y0       = (stbtt_int16)  r->y;
bc->x1       = (stbtt_int16) (r->x + r->w);
bc->y1       = (stbtt_int16) (r->y + r->h);
bc->xadvance =                scale * advance;
bc->xoff     =       (float)  x0 * recip_h + sub_x;
bc->yoff     =       (float)  y0 * recip_v + sub_y;
bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;

if (glyph == 0)
missing_glyph = j;
} else if (spc->skip_missing) {
return_value = 0;
} else if (r->was_packed && r->w == 0 && r->h == 0 && missing_glyph >= 0) {
ranges[i].chardata_for_range[j] = ranges[i].chardata_for_range[missing_glyph];
} else {
return_value = 0; /*  if any fail, report failure */
}

++k;
}
}

/*  restore original values */
spc->h_oversample = old_h_over;
spc->v_oversample = old_v_over;

return return_value;
}